

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZDICT_optimizeTrainFromBuffer_cover
                 (void *dictBuffer,size_t dictBufferCapacity,void *samplesBuffer,
                 size_t *samplesSizes,uint nbSamples,ZDICT_cover_params_t *parameters)

{
  uint uVar1;
  double splitPoint;
  long lVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ZSTD_customMem customMem;
  uint uVar7;
  size_t sVar8;
  int iVar9;
  POOL_ctx *ctx_00;
  size_t sVar10;
  long *__ptr;
  clock_t cVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint d;
  bool bVar18;
  bool bVar19;
  ulong uVar20;
  COVER_best_t best;
  COVER_ctx_t ctx;
  size_t local_158;
  pthread_mutex_t local_130;
  pthread_cond_t local_108;
  long local_d8;
  void *pvStack_d0;
  size_t local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  double local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  ulong local_90;
  COVER_ctx_t local_88;
  
  uVar20 = -(ulong)(0.0 < parameters->splitPoint);
  uVar1 = parameters->k;
  uVar13 = parameters->d;
  bVar18 = uVar13 == 0;
  d = 6;
  if (!bVar18) {
    d = uVar13;
  }
  uVar15 = 8;
  if (!bVar18) {
    uVar15 = uVar13;
  }
  uVar13 = 0x28;
  if (parameters->steps != 0) {
    uVar13 = parameters->steps;
  }
  bVar19 = uVar1 != 0;
  uVar16 = 0x32;
  if (bVar19) {
    uVar16 = uVar1;
  }
  uVar17 = 2000;
  if (bVar19) {
    uVar17 = uVar1;
  }
  uVar14 = 0x79e;
  if (bVar19) {
    uVar14 = 0;
  }
  iVar9 = (int)(uVar14 / uVar13);
  splitPoint = (double)(~uVar20 & 0x3ff0000000000000 | (ulong)parameters->splitPoint & uVar20);
  uVar1 = (parameters->zParams).notificationLevel;
  if (splitPoint <= 1.0) {
    if (uVar16 < uVar15 || uVar17 < uVar16) {
      uVar20 = 0xffffffffffffffd6;
      if (0 < (int)uVar1) {
        ZDICT_optimizeTrainFromBuffer_cover_cold_11();
      }
    }
    else if (nbSamples == 0) {
      uVar20 = 0xffffffffffffffb8;
      if (0 < g_displayLevel) {
        ZDICT_optimizeTrainFromBuffer_cover_cold_10();
      }
    }
    else if (dictBufferCapacity < 0x100) {
      uVar20 = 0xffffffffffffffba;
      if (0 < g_displayLevel) {
        ZDICT_optimizeTrainFromBuffer_cover_cold_9();
      }
    }
    else {
      if (parameters->nbThreads < 2) {
        ctx_00 = (POOL_ctx *)(ulong)(uint)(0 << bVar18);
      }
      else {
        customMem.opaque = (void *)0x0;
        customMem.customAlloc = (ZSTD_allocFunction)0x0;
        customMem.customFree = (ZSTD_freeFunction)0x0;
        ctx_00 = POOL_create_advanced((ulong)parameters->nbThreads,1,customMem);
        if (ctx_00 == (POOL_ctx *)0x0) {
          return 0xffffffffffffffc0;
        }
      }
      pthread_mutex_init(&local_130,(pthread_mutexattr_t *)0x0);
      pthread_cond_init(&local_108,(pthread_condattr_t *)0x0);
      local_d8 = 0;
      pvStack_d0 = (void *)0x0;
      local_c8 = 0;
      local_90 = 0xffffffffffffffff;
      local_c0 = 0;
      uStack_b8 = 0;
      local_b0 = 0.0;
      uStack_a8 = 0;
      local_a0 = 0;
      uStack_98 = 0;
      g_displayLevel = uVar1 - 1;
      bVar18 = g_displayLevel != 0;
      if (uVar1 == 0) {
        g_displayLevel = 0;
      }
      if (bVar18 && 0 < (int)uVar1) {
        ZDICT_optimizeTrainFromBuffer_cover_cold_1();
      }
      if (d <= uVar15) {
        bVar18 = false;
        do {
          if (2 < (int)uVar1) {
            ZDICT_optimizeTrainFromBuffer_cover_cold_2();
          }
          sVar10 = COVER_ctx_init(&local_88,samplesBuffer,samplesSizes,nbSamples,d,splitPoint);
          if (0xffffffffffffff88 < sVar10) {
            if (0 < (int)uVar1) {
              ZDICT_optimizeTrainFromBuffer_cover_cold_3();
            }
            COVER_best_destroy((COVER_best_t *)&local_130.__data);
            POOL_free(ctx_00);
            local_158 = sVar10;
          }
          if (sVar10 < 0xffffffffffffff89) {
            uVar7 = uVar16;
            if (!bVar18) {
              COVER_warnOnSmallCorpus(dictBufferCapacity,local_88.suffixSize,uVar1);
            }
            for (; uVar7 <= uVar17; uVar7 = uVar7 + iVar9 + (uint)(iVar9 == 0)) {
              __ptr = (long *)malloc(0x48);
              if (2 < (int)uVar1) {
                ZDICT_optimizeTrainFromBuffer_cover_cold_4();
              }
              if (__ptr == (long *)0x0) {
                if (0 < (int)uVar1) {
                  ZDICT_optimizeTrainFromBuffer_cover_cold_7();
                }
                COVER_best_destroy((COVER_best_t *)&local_130.__data);
                COVER_ctx_destroy(&local_88);
                POOL_free(ctx_00);
                local_158 = 0xffffffffffffffc0;
                iVar12 = 1;
LAB_001a222c:
                bVar19 = false;
              }
              else {
                *__ptr = (long)&local_88;
                __ptr[1] = (long)&local_130;
                __ptr[2] = dictBufferCapacity;
                lVar2 = *(long *)&parameters->steps;
                dVar3 = parameters->splitPoint;
                lVar4 = *(long *)&parameters->shrinkDict;
                lVar5 = *(long *)&parameters->zParams;
                lVar6 = *(long *)&(parameters->zParams).dictID;
                __ptr[3] = *(long *)parameters;
                __ptr[4] = lVar2;
                __ptr[5] = (long)dVar3;
                __ptr[6] = lVar4;
                __ptr[7] = lVar5;
                __ptr[8] = lVar6;
                *(uint *)(__ptr + 3) = uVar7;
                *(uint *)((long)__ptr + 0x1c) = d;
                __ptr[5] = (long)splitPoint;
                *(uint *)(__ptr + 4) = uVar13;
                *(undefined4 *)(__ptr + 6) = 0;
                iVar12 = g_displayLevel;
                *(int *)((long)__ptr + 0x3c) = g_displayLevel;
                if ((((dictBufferCapacity < uVar7) || (uVar7 <= d - 1)) || (splitPoint <= 0.0)) ||
                   (1.0 < splitPoint)) {
                  if (0 < iVar12) {
                    ZDICT_optimizeTrainFromBuffer_cover_cold_6();
                  }
                  free(__ptr);
                  iVar12 = 7;
                  goto LAB_001a222c;
                }
                pthread_mutex_lock(&local_130);
                local_d8 = local_d8 + 1;
                pthread_mutex_unlock(&local_130);
                if (ctx_00 == (POOL_ctx *)0x0) {
                  COVER_tryParameters(__ptr);
                }
                else {
                  POOL_add(ctx_00,COVER_tryParameters,__ptr);
                }
                if ((1 < (int)uVar1) &&
                   ((cVar11 = clock(), 150000 < cVar11 - g_time || (3 < (int)uVar1)))) {
                  ZDICT_optimizeTrainFromBuffer_cover_cold_5();
                }
                iVar12 = 0;
                bVar19 = true;
              }
              if ((iVar12 != 7) && (iVar12 != 0)) goto LAB_001a209a;
            }
            COVER_best_wait((COVER_best_t *)&local_130.__data);
            COVER_ctx_destroy(&local_88);
            bVar19 = true;
LAB_001a209a:
            bVar18 = true;
          }
          else {
            bVar19 = false;
          }
          if (!bVar19) {
            return local_158;
          }
          d = d + 2;
        } while (d <= uVar15);
      }
      if (1 < (int)uVar1) {
        ZDICT_optimizeTrainFromBuffer_cover_cold_8();
      }
      sVar8 = local_c8;
      uVar20 = local_90;
      if (local_90 < 0xffffffffffffff89) {
        (parameters->zParams).compressionLevel = (undefined4)local_a0;
        (parameters->zParams).notificationLevel = local_a0._4_4_;
        *(undefined8 *)&(parameters->zParams).dictID = uStack_98;
        parameters->splitPoint = local_b0;
        parameters->shrinkDict = (undefined4)uStack_a8;
        parameters->shrinkDictMaxRegression = uStack_a8._4_4_;
        parameters->k = (undefined4)local_c0;
        parameters->d = local_c0._4_4_;
        parameters->steps = (undefined4)uStack_b8;
        parameters->nbThreads = uStack_b8._4_4_;
        memcpy(dictBuffer,pvStack_d0,local_c8);
        uVar20 = sVar8;
      }
      COVER_best_destroy((COVER_best_t *)&local_130.__data);
      POOL_free(ctx_00);
    }
  }
  else {
    uVar20 = 0xffffffffffffffd6;
    if (0 < (int)uVar1) {
      ZDICT_optimizeTrainFromBuffer_cover_cold_12();
    }
  }
  return uVar20;
}

Assistant:

ZDICTLIB_API size_t ZDICT_optimizeTrainFromBuffer_cover(
    void* dictBuffer, size_t dictBufferCapacity, const void* samplesBuffer,
    const size_t* samplesSizes, unsigned nbSamples,
    ZDICT_cover_params_t* parameters)
{
  /* constants */
  const unsigned nbThreads = parameters->nbThreads;
  const double splitPoint =
      parameters->splitPoint <= 0.0 ? COVER_DEFAULT_SPLITPOINT : parameters->splitPoint;
  const unsigned kMinD = parameters->d == 0 ? 6 : parameters->d;
  const unsigned kMaxD = parameters->d == 0 ? 8 : parameters->d;
  const unsigned kMinK = parameters->k == 0 ? 50 : parameters->k;
  const unsigned kMaxK = parameters->k == 0 ? 2000 : parameters->k;
  const unsigned kSteps = parameters->steps == 0 ? 40 : parameters->steps;
  const unsigned kStepSize = MAX((kMaxK - kMinK) / kSteps, 1);
  const unsigned kIterations =
      (1 + (kMaxD - kMinD) / 2) * (1 + (kMaxK - kMinK) / kStepSize);
  const unsigned shrinkDict = 0;
  /* Local variables */
  const int displayLevel = parameters->zParams.notificationLevel;
  unsigned iteration = 1;
  unsigned d;
  unsigned k;
  COVER_best_t best;
  POOL_ctx *pool = NULL;
  int warned = 0;

  /* Checks */
  if (splitPoint <= 0 || splitPoint > 1) {
    LOCALDISPLAYLEVEL(displayLevel, 1, "Incorrect parameters\n");
    return ERROR(parameter_outOfBound);
  }
  if (kMinK < kMaxD || kMaxK < kMinK) {
    LOCALDISPLAYLEVEL(displayLevel, 1, "Incorrect parameters\n");
    return ERROR(parameter_outOfBound);
  }
  if (nbSamples == 0) {
    DISPLAYLEVEL(1, "Cover must have at least one input file\n");
    return ERROR(srcSize_wrong);
  }
  if (dictBufferCapacity < ZDICT_DICTSIZE_MIN) {
    DISPLAYLEVEL(1, "dictBufferCapacity must be at least %u\n",
                 ZDICT_DICTSIZE_MIN);
    return ERROR(dstSize_tooSmall);
  }
  if (nbThreads > 1) {
    pool = POOL_create(nbThreads, 1);
    if (!pool) {
      return ERROR(memory_allocation);
    }
  }
  /* Initialization */
  COVER_best_init(&best);
  /* Turn down global display level to clean up display at level 2 and below */
  g_displayLevel = displayLevel == 0 ? 0 : displayLevel - 1;
  /* Loop through d first because each new value needs a new context */
  LOCALDISPLAYLEVEL(displayLevel, 2, "Trying %u different sets of parameters\n",
                    kIterations);
  for (d = kMinD; d <= kMaxD; d += 2) {
    /* Initialize the context for this value of d */
    COVER_ctx_t ctx;
    LOCALDISPLAYLEVEL(displayLevel, 3, "d=%u\n", d);
    {
      const size_t initVal = COVER_ctx_init(&ctx, samplesBuffer, samplesSizes, nbSamples, d, splitPoint);
      if (ZSTD_isError(initVal)) {
        LOCALDISPLAYLEVEL(displayLevel, 1, "Failed to initialize context\n");
        COVER_best_destroy(&best);
        POOL_free(pool);
        return initVal;
      }
    }
    if (!warned) {
      COVER_warnOnSmallCorpus(dictBufferCapacity, ctx.suffixSize, displayLevel);
      warned = 1;
    }
    /* Loop through k reusing the same context */
    for (k = kMinK; k <= kMaxK; k += kStepSize) {
      /* Prepare the arguments */
      COVER_tryParameters_data_t *data = (COVER_tryParameters_data_t *)malloc(
          sizeof(COVER_tryParameters_data_t));
      LOCALDISPLAYLEVEL(displayLevel, 3, "k=%u\n", k);
      if (!data) {
        LOCALDISPLAYLEVEL(displayLevel, 1, "Failed to allocate parameters\n");
        COVER_best_destroy(&best);
        COVER_ctx_destroy(&ctx);
        POOL_free(pool);
        return ERROR(memory_allocation);
      }
      data->ctx = &ctx;
      data->best = &best;
      data->dictBufferCapacity = dictBufferCapacity;
      data->parameters = *parameters;
      data->parameters.k = k;
      data->parameters.d = d;
      data->parameters.splitPoint = splitPoint;
      data->parameters.steps = kSteps;
      data->parameters.shrinkDict = shrinkDict;
      data->parameters.zParams.notificationLevel = g_displayLevel;
      /* Check the parameters */
      if (!COVER_checkParameters(data->parameters, dictBufferCapacity)) {
        DISPLAYLEVEL(1, "Cover parameters incorrect\n");
        free(data);
        continue;
      }
      /* Call the function and pass ownership of data to it */
      COVER_best_start(&best);
      if (pool) {
        POOL_add(pool, &COVER_tryParameters, data);
      } else {
        COVER_tryParameters(data);
      }
      /* Print status */
      LOCALDISPLAYUPDATE(displayLevel, 2, "\r%u%%       ",
                         (unsigned)((iteration * 100) / kIterations));
      ++iteration;
    }
    COVER_best_wait(&best);
    COVER_ctx_destroy(&ctx);
  }
  LOCALDISPLAYLEVEL(displayLevel, 2, "\r%79s\r", "");
  /* Fill the output buffer and parameters with output of the best parameters */
  {
    const size_t dictSize = best.dictSize;
    if (ZSTD_isError(best.compressedSize)) {
      const size_t compressedSize = best.compressedSize;
      COVER_best_destroy(&best);
      POOL_free(pool);
      return compressedSize;
    }
    *parameters = best.parameters;
    memcpy(dictBuffer, best.dict, dictSize);
    COVER_best_destroy(&best);
    POOL_free(pool);
    return dictSize;
  }
}